

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib597.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  char *pcVar9;
  undefined8 uVar10;
  timeval tVar11;
  undefined8 uStack_1f0;
  int maxfd;
  undefined8 local_1e0;
  int local_1d8;
  int running;
  long timeout;
  timeval local_1c8;
  int msgs_left;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar10 = _stderr;
  if (iVar1 == 0) {
    lVar4 = curl_easy_init();
    if (lVar4 == 0) {
      lVar5 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                    ,0x3f);
      iVar1 = 0x7c;
    }
    else {
      lVar5 = curl_multi_init();
      if (lVar5 != 0) {
        iVar2 = 0;
LAB_00102328:
        iVar1 = 0;
        if (iVar2 == 2) goto LAB_0010279c;
        local_1d8 = iVar2;
        iVar1 = curl_easy_setopt(lVar4,0x29,1);
        uVar10 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar4,0x2712,URL);
          uVar10 = _stderr;
          if (iVar1 != 0) {
            uVar3 = curl_easy_strerror(iVar1);
            pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            uStack_1f0 = 0x48;
            goto LAB_001028f6;
          }
          if (local_1d8 == 0) {
            iVar1 = curl_easy_setopt(lVar4,0x8d,1);
            uVar10 = _stderr;
            if (iVar1 != 0) {
              uVar3 = curl_easy_strerror(iVar1);
              pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
              uStack_1f0 = 0x4c;
              goto LAB_001028f6;
            }
LAB_001023df:
            iVar1 = curl_multi_add_handle(lVar5,lVar4);
            uVar10 = _stderr;
            if (iVar1 != 0) {
              uVar3 = curl_multi_strerror(iVar1);
              pcVar9 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
              uStack_1f0 = 0x55;
              goto LAB_001028f6;
            }
LAB_001023f2:
            timeout = -99;
            maxfd = -99;
            iVar1 = curl_multi_perform(lVar5,&running);
            uVar10 = _stderr;
            if (iVar1 != 0) {
              uVar3 = curl_multi_strerror(iVar1);
              pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
              uStack_1f0 = 0x5f;
              goto LAB_001028f6;
            }
            if (running < 0) {
              pcVar9 = 
              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
              ;
              uStack_1f0 = 0x5f;
LAB_001026d9:
              curl_mfprintf(_stderr,pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                            ,uStack_1f0);
              iVar1 = 0x7a;
              goto LAB_0010279c;
            }
            tVar11 = tutil_tvnow();
            lVar6 = tutil_tvdiff(tVar11,tv_test_start);
            if (5000 < lVar6) {
              uStack_1f0 = 0x61;
              goto LAB_00102790;
            }
            if (running != 0) {
              for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
                fdread.__fds_bits[lVar6] = 0;
              }
              for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
                fdwrite.__fds_bits[lVar6] = 0;
              }
              for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
                fdexcep.__fds_bits[lVar6] = 0;
              }
              iVar1 = curl_multi_fdset(lVar5,&fdread,&fdwrite,&fdexcep,&maxfd);
              uVar10 = _stderr;
              if (iVar1 == 0) {
                if (maxfd < -1) {
                  pcVar9 = 
                  "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
                  uStack_1f0 = 0x6a;
                  goto LAB_001026d9;
                }
                iVar1 = curl_multi_timeout(lVar5,&timeout);
                uVar10 = _stderr;
                if (iVar1 == 0) {
                  if (timeout < -1) {
                    curl_mfprintf(_stderr,
                                  "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                                  ,0x6e,timeout);
                    iVar1 = 0x73;
                  }
                  else {
                    if (timeout == -1) {
                      local_1c8.tv_sec = 6;
                      local_1c8.tv_usec = 0;
                    }
                    else {
                      uVar7 = timeout;
                      if (0x7ffffffe < (ulong)timeout) {
                        uVar7 = 0x7fffffff;
                      }
                      local_1c8.tv_sec = (uVar7 & 0xffffffff) / 1000;
                      local_1c8.tv_usec =
                           (__suseconds_t)(uint)((int)((uVar7 & 0xffffffff) % 1000) * 1000);
                    }
                    iVar1 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&local_1c8);
                    if (iVar1 != -1) goto code_r0x0010255a;
                    piVar8 = __errno_location();
                    uVar10 = _stderr;
                    iVar1 = *piVar8;
                    pcVar9 = strerror(iVar1);
                    curl_mfprintf(uVar10,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                                  ,0x7d,iVar1,pcVar9);
                    iVar1 = 0x79;
                  }
                  goto LAB_0010279c;
                }
                uVar3 = curl_multi_strerror(iVar1);
                pcVar9 = "%s:%d curl_multi_timeout() failed, with code %d (%s)\n";
                uStack_1f0 = 0x6e;
              }
              else {
                uVar3 = curl_multi_strerror(iVar1);
                pcVar9 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                uStack_1f0 = 0x6a;
              }
              goto LAB_001028f6;
            }
            lVar6 = curl_multi_info_read(lVar5,&msgs_left);
            if (lVar6 == 0) {
              local_1e0 = (ulong)local_1e0._4_4_ << 0x20;
            }
            else {
              local_1e0 = CONCAT44(local_1e0._4_4_,*(undefined4 *)(lVar6 + 0x10));
            }
            iVar1 = curl_multi_remove_handle(lVar5,lVar4);
            uVar10 = _stderr;
            if (iVar1 != 0) {
              uVar3 = curl_multi_strerror(iVar1);
              pcVar9 = "%s:%d curl_multi_remove_handle() failed, with code %d (%s)\n";
              uStack_1f0 = 0x86;
              goto LAB_001028f6;
            }
            iVar2 = local_1d8 + 1;
            iVar1 = (int)local_1e0;
            if ((int)local_1e0 != 0) goto LAB_0010279c;
            goto LAB_00102328;
          }
          iVar1 = curl_easy_setopt(lVar4,0x8d,0);
          uVar10 = _stderr;
          if (iVar1 != 0) {
            uVar3 = curl_easy_strerror(iVar1);
            pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            uStack_1f0 = 0x50;
            goto LAB_001028f6;
          }
          local_1e0 = lVar5;
          iVar1 = curl_easy_setopt(lVar4,0x2c,1);
          uVar10 = _stderr;
          if (iVar1 != 0) {
            uVar3 = curl_easy_strerror(iVar1);
            curl_mfprintf(uVar10,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                          ,0x51,iVar1,uVar3);
            lVar5 = local_1e0;
            goto LAB_0010279c;
          }
          iVar1 = curl_easy_setopt(lVar4,0x4b,1);
          lVar5 = local_1e0;
          uVar10 = _stderr;
          if (iVar1 == 0) goto LAB_001023df;
          uVar3 = curl_easy_strerror(iVar1);
          pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          uStack_1f0 = 0x52;
        }
        else {
          uVar3 = curl_easy_strerror(iVar1);
          pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          uStack_1f0 = 0x45;
        }
LAB_001028f6:
        curl_mfprintf(uVar10,pcVar9,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                      ,uStack_1f0,iVar1,uVar3);
        goto LAB_0010279c;
      }
      lVar5 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                    ,0x41);
      iVar1 = 0x7b;
    }
LAB_0010279c:
    curl_multi_cleanup(lVar5);
    curl_easy_cleanup(lVar4);
    curl_global_cleanup();
  }
  else {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar10,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                  ,0x3d,iVar1,uVar3);
  }
  return iVar1;
code_r0x0010255a:
  tVar11 = tutil_tvnow();
  lVar6 = tutil_tvdiff(tVar11,tv_test_start);
  if (5000 < lVar6) {
    uStack_1f0 = 0x7f;
LAB_00102790:
    curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                  ,uStack_1f0);
    iVar1 = 0x7d;
    goto LAB_0010279c;
  }
  goto LAB_001023f2;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURLM *multi = NULL;
  int res = 0;
  int running;
  int msgs_left;
  int phase;
  CURLMsg *msg;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(easy);

  multi_init(multi);

  for(phase = CONNECT_ONLY_PHASE; phase < LAST_PHASE; ++phase) {
    /* go verbose */
    easy_setopt(easy, CURLOPT_VERBOSE, 1L);

    /* specify target */
    easy_setopt(easy, CURLOPT_URL, URL);

    /* enable 'CONNECT_ONLY' option when in connect phase */
    if(phase == CONNECT_ONLY_PHASE)
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 1L);

    /* enable 'NOBODY' option to send 'QUIT' command in quit phase */
    if(phase == QUIT_PHASE) {
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 0L);
      easy_setopt(easy, CURLOPT_NOBODY, 1L);
      easy_setopt(easy, CURLOPT_FORBID_REUSE, 1L);
    }

    multi_add_handle(multi, easy);

    for(;;) {
      struct timeval interval;
      fd_set fdread;
      fd_set fdwrite;
      fd_set fdexcep;
      long timeout = -99;
      int maxfd = -99;

      multi_perform(multi, &running);

      abort_on_test_timeout();

      if(!running)
        break; /* done */

      FD_ZERO(&fdread);
      FD_ZERO(&fdwrite);
      FD_ZERO(&fdexcep);

      multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

      /* At this point, maxfd is guaranteed to be greater or equal than -1. */

      multi_timeout(multi, &timeout);

      /* At this point, timeout is guaranteed to be greater or equal than
         -1. */

      if(timeout != -1L) {
        int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
        interval.tv_sec = itimeout/1000;
        interval.tv_usec = (itimeout%1000)*1000;
      }
      else {
        interval.tv_sec = TEST_HANG_TIMEOUT/1000 + 1;
        interval.tv_usec = 0;
      }

      select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);

      abort_on_test_timeout();
    }

    msg = curl_multi_info_read(multi, &msgs_left);
    if(msg)
      res = msg->data.result;

    multi_remove_handle(multi, easy);
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  return res;
}